

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O1

any * __thiscall Omega_h::AssignOp::eval(any *__return_storage_ptr__,AssignOp *this,ExprEnv *env)

{
  mapped_type *this_00;
  storage_union local_30;
  long local_20;
  
  (*((this->rhs).super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ExprOp[2])(&local_30);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
            ::operator[](&env->variables,&this->name);
  any::operator=(this_00,(any *)&local_30);
  if (local_20 != 0) {
    (**(code **)(local_20 + 8))(&local_30);
  }
  __return_storage_ptr__->vtable = (vtable_type *)0x0;
  return __return_storage_ptr__;
}

Assistant:

any AssignOp::eval(ExprEnv& env) {
  env.variables[name] = rhs->eval(env);
  return any();
}